

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPFakeTransmitter::SendRTPData(RTPFakeTransmitter *this,void *data,size_t len)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  int iVar3;
  
  iVar3 = -0x84;
  if (((this->init == true) && (iVar3 = -0x83, this->created == true)) &&
     (iVar3 = -0x86, len <= this->maxpacksize)) {
    pHVar2 = (this->destinations).firsthashelem;
    (this->destinations).curhashelem = pHVar2;
    iVar3 = 0;
    while (pHVar2 != (HashElement *)0x0) {
      (*this->params->packetreadycb)
                (this->params->packetreadycbdata,(uint8_t *)data,(uint16_t)len,
                 (pHVar2->element).rtpaddr.sin_addr.s_addr,(pHVar2->element).rtpaddr.sin_port,1);
      pHVar1 = (this->destinations).curhashelem;
      pHVar2 = (HashElement *)0x0;
      if (pHVar1 != (HashElement *)0x0) {
        pHVar2 = pHVar1->listnext;
        (this->destinations).curhashelem = pHVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int RTPFakeTransmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}


	destinations.GotoFirstElement();
    // send to each destination
	while (destinations.HasCurrentElement())
	{
        (*params->GetPacketReadyCB())(params->GetPacketReadyCBData(), (uint8_t*)data, len,
        destinations.GetCurrentElement().GetIP_NBO(),
        destinations.GetCurrentElement().GetRTPPort_NBO(),
        1);
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}